

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O1

void loop_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  m680x_reg mVar2;
  cs_detail *pcVar3;
  ushort uVar4;
  ushort uVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  
  uVar5 = *address;
  *address = uVar5 + 1;
  lVar6 = (ulong)uVar5 - (ulong)info->offset;
  if ((uint)lVar6 < info->size) {
    bVar7 = info->code[lVar6];
  }
  else {
    bVar7 = 0;
  }
  info->insn = loop_hdlr::index_to_insn_id[bVar7 >> 5];
  if (0xbf < bVar7) {
    loop_hdlr_cold_1();
  }
  uVar5 = *address;
  *address = uVar5 + 1;
  lVar6 = (ulong)uVar5 - (ulong)info->offset;
  uVar5 = 0;
  if ((uint)lVar6 < info->size) {
    uVar5 = (ushort)info->code[lVar6];
  }
  mVar2 = loop_hdlr::index_to_reg_id[bVar7 & 7];
  bVar1 = (info->m680x).op_count;
  bVar8 = bVar1 + 1;
  (info->m680x).op_count = bVar8;
  (info->m680x).operands[bVar1].type = M680X_OP_REGISTER;
  (info->m680x).operands[bVar1].field_1.reg = mVar2;
  (info->m680x).operands[bVar1].size = info->cpu->reg_byte_size[mVar2];
  (info->m680x).op_count = bVar1 + 2;
  uVar4 = uVar5 - 0x100;
  if ((bVar7 & 0x10) == 0) {
    uVar4 = uVar5;
  }
  (info->m680x).operands[bVar8].type = M680X_OP_RELATIVE;
  (info->m680x).operands[bVar8].field_1.rel.offset = uVar4;
  (info->m680x).operands[bVar8].field_1.rel.address = uVar4 + *address;
  pcVar3 = MI->flat_insn->detail;
  if (pcVar3 != (cs_detail *)0x0) {
    bVar7 = pcVar3->groups_count;
    pcVar3->groups_count = bVar7 + 1;
    pcVar3->groups[bVar7] = '\a';
  }
  return;
}

Assistant:

static void loop_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	static const m680x_reg index_to_reg_id[] = {
		M680X_REG_A, M680X_REG_B, M680X_REG_INVALID, M680X_REG_INVALID,
		M680X_REG_D, M680X_REG_X, M680X_REG_Y, M680X_REG_S,
	};
	static const m680x_insn index_to_insn_id[] = {
		M680X_INS_DBEQ, M680X_INS_DBNE, M680X_INS_TBEQ, M680X_INS_TBNE,
		M680X_INS_IBEQ, M680X_INS_IBNE, M680X_INS_ILLGL, M680X_INS_ILLGL
	};
	cs_m680x *m680x = &info->m680x;
	uint8_t post_byte = 0;
	uint8_t rel = 0;
	cs_m680x_op *op;

	read_byte(info, &post_byte, (*address)++);

	info->insn = index_to_insn_id[(post_byte >> 5) & 0x07];

	if (info->insn == M680X_INS_ILLGL) {
		fprintf(stderr, "Internal error: Unexpected post byte "
			"in loop instruction %02X.\n", post_byte);
		illegal_hdlr(MI, info, address);
	};

	read_byte(info, &rel, (*address)++);

	add_reg_operand(info, index_to_reg_id[post_byte & 0x07]);

	op = &m680x->operands[m680x->op_count++];

	op->type = M680X_OP_RELATIVE;

	op->rel.offset = (post_byte & 0x10) ? 0xff00 | rel : rel;

	op->rel.address = *address + op->rel.offset;

	add_insn_group(MI->flat_insn->detail, M680X_GRP_BRAREL);
}